

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O0

void aes_cbc_ni_decrypt(ssh_cipher *ciph,void *vblk,int blklen,aes_ni_fn decrypt)

{
  ssh_cipheralg *psVar1;
  ssh_cipheralg *psVar2;
  ssh_cipheralg *psVar3;
  uint8_t *puVar4;
  undefined4 in_register_00000014;
  __m128i *palVar5;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qb;
  __m128i alVar6;
  __m128i plaintext;
  __m128i decrypted;
  __m128i ciphertext;
  uint8_t *finish;
  uint8_t *blk;
  aes_ni_context *ctx;
  aes_ni_fn decrypt_local;
  int blklen_local;
  void *vblk_local;
  ssh_cipher *ciph_local;
  
  palVar5 = (__m128i *)CONCAT44(in_register_00000014,blklen);
  puVar4 = (uint8_t *)((long)vblk + (long)blklen);
  for (finish = (uint8_t *)vblk; finish < puVar4; finish = finish + 0x10) {
    psVar1 = *(ssh_cipheralg **)finish;
    psVar2 = *(ssh_cipheralg **)(finish + 8);
    alVar6[0] = ciph + -0x21;
    alVar6[1] = (longlong)vblk;
    alVar6 = (*decrypt)(alVar6,palVar5);
    palVar5 = alVar6[1];
    psVar3 = ciph[-2].vt;
    *(ulong *)finish = extraout_XMM0_Qa ^ (ulong)ciph[-3].vt;
    *(ulong *)(finish + 8) = extraout_XMM0_Qb ^ (ulong)psVar3;
    ciph[-3].vt = psVar1;
    ciph[-2].vt = psVar2;
  }
  return;
}

Assistant:

static inline void aes_cbc_ni_decrypt(
    ssh_cipher *ciph, void *vblk, int blklen, aes_ni_fn decrypt)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        __m128i ciphertext = _mm_loadu_si128((const __m128i *)blk);
        __m128i decrypted = decrypt(ciphertext, ctx->keysched_d);
        __m128i plaintext = _mm_xor_si128(decrypted, ctx->iv);
        _mm_storeu_si128((__m128i *)blk, plaintext);
        ctx->iv = ciphertext;
    }
}